

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O3

void deqp::egl::getDefaultFilterLists
               (vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                *lists,FilterList *baseFilters)

{
  uint uVar1;
  bool bVar2;
  long *plVar3;
  FilterList *pFVar4;
  long *plVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  NamedFilterList filters;
  string name;
  allocator<char> local_135;
  uint local_134;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  NamedFilterList local_110;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *local_98;
  FilterList *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long local_68;
  anon_struct_16_2_3c8bed26 *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar7 = 0;
  local_98 = lists;
  local_90 = baseFilters;
  do {
    local_60 = getDefaultFilterLists::s_colorRules + lVar7;
    local_58 = getDefaultFilterLists::s_colorRules[lVar7].name;
    local_134 = (uint)CONCAT71((int7)((ulong)local_58 >> 8),1);
    lVar8 = 0;
    local_68 = lVar7;
    do {
      lVar7 = 0;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_58,&local_135);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        local_130 = &local_120;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_120 = *plVar5;
          lStack_118 = plVar3[3];
        }
        else {
          local_120 = *plVar5;
          local_130 = (long *)*plVar3;
        }
        local_128 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_b8 = &local_a8;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_a8 = *plVar5;
          lStack_a0 = plVar3[3];
        }
        else {
          local_a8 = *plVar5;
          local_b8 = (long *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_110.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&local_110.super_FilterList.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data + 0x10);
        plVar5 = plVar3 + 2;
        if ((pointer *)*plVar3 == (pointer *)plVar5) {
          local_110.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
          local_110.m_name._M_dataplus._M_p = (pointer)plVar3[3];
        }
        else {
          local_110.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
          local_110.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar3;
        }
        local_110.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_88 = &local_78;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_78 = *plVar5;
          lStack_70 = plVar3[3];
        }
        else {
          local_78 = *plVar5;
          local_88 = (long *)*plVar3;
        }
        local_80 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((pointer *)
            local_110.super_FilterList.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer *)
            ((long)&local_110.super_FilterList.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data + 0x10U)) {
          operator_delete(local_110.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_110.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        NamedFilterList::NamedFilterList(&local_110,(char *)local_88,"");
        pFVar4 = eglu::FilterList::operator<<(&local_110.super_FilterList,local_90);
        pFVar4 = eglu::FilterList::operator<<(pFVar4,local_60->filter);
        pFVar4 = eglu::FilterList::operator<<
                           (pFVar4,getDefaultFilterLists::s_depthRules[lVar8].filter);
        pFVar4 = eglu::FilterList::operator<<
                           (pFVar4,getDefaultFilterLists::s_stencilRules[lVar7].filter);
        eglu::FilterList::operator<<(pFVar4,isConformant);
        std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::
        push_back(local_98,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.m_description._M_dataplus._M_p != &local_110.m_description.field_2) {
          operator_delete(local_110.m_description._M_dataplus._M_p,
                          local_110.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
          operator_delete(local_110.m_name._M_dataplus._M_p,
                          local_110.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_110.super_FilterList.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_110.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_110.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        lVar7 = 1;
        bVar2 = false;
      } while (bVar6);
      lVar8 = 1;
      uVar1 = local_134 & 1;
      local_134 = 0;
    } while (uVar1 != 0);
    lVar7 = local_68 + 1;
  } while (lVar7 != 5);
  NamedFilterList::NamedFilterList(&local_110,"other","All other configs");
  pFVar4 = eglu::FilterList::operator<<(&local_110.super_FilterList,local_90);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,notColorBits<5,6,5,0>);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,notColorBits<8,8,8,0>);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,notColorBits<4,4,4,4>);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,notColorBits<5,5,5,1>);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,notColorBits<8,8,8,8>);
  pFVar4 = eglu::FilterList::operator<<(pFVar4,isConformant);
  eglu::FilterList::operator<<(pFVar4,notFloat);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::push_back
            (local_98,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_description._M_dataplus._M_p != &local_110.m_description.field_2) {
    operator_delete(local_110.m_description._M_dataplus._M_p,
                    local_110.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
    operator_delete(local_110.m_name._M_dataplus._M_p,
                    local_110.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_110.super_FilterList.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_110.super_FilterList.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getDefaultFilterLists (vector<NamedFilterList>& lists, const FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0> },
		{ "rgb888",		colorBits<8, 8, 8, 0> },
		{ "rgba4444",	colorBits<4, 4, 4, 4> },
		{ "rgba5551",	colorBits<5, 5, 5, 1> },
		{ "rgba8888",	colorBits<8, 8, 8, 8> }
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_depthRules[] =
	{
		{ "no_depth",	noDepth		},
		{ "depth",		hasDepth	},
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_stencilRules[] =
	{
		{ "no_stencil",	noStencil	},
		{ "stencil",	hasStencil	},
	};

	for (int colorRuleNdx = 0; colorRuleNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorRuleNdx++)
	{
		for (int depthRuleNdx = 0; depthRuleNdx < DE_LENGTH_OF_ARRAY(s_depthRules); depthRuleNdx++)
		{
			for (int stencilRuleNdx = 0; stencilRuleNdx < DE_LENGTH_OF_ARRAY(s_stencilRules); stencilRuleNdx++)
			{
				const string		name		= string(s_colorRules[colorRuleNdx].name) + "_" + s_depthRules[depthRuleNdx].name + "_" + s_stencilRules[stencilRuleNdx].name;
				NamedFilterList		filters		(name.c_str(), "");

				filters << baseFilters
						<< s_colorRules[colorRuleNdx].filter
						<< s_depthRules[depthRuleNdx].filter
						<< s_stencilRules[stencilRuleNdx].filter
						<< isConformant;

				lists.push_back(filters);
			}
		}
	}

	// Build "other" set - not configs that don't match any of known color rules
	{
		NamedFilterList		filters		("other", "All other configs");

		// \todo [2014-12-18 pyry] Optimize rules
		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		lists.push_back(filters);
	}
}